

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

void MWT::predict_or_learn<true,false,true>(mwt *c,single_learner *base,example *ec)

{
  uint32_t uVar1;
  byte *pbVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  vw *pvVar5;
  ulong uVar6;
  uchar *puVar7;
  double dVar8;
  cb_class *pcVar9;
  unsigned_long *puVar10;
  long lVar11;
  long lVar12;
  uint32_t *puVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong *puVar16;
  policy_data *ppVar17;
  features *pfVar18;
  float *pfVar19;
  features *pfVar20;
  features *pfVar21;
  uint64_t *puVar22;
  float *pfVar23;
  features *pfVar24;
  v_array<unsigned_char> *__range3;
  bool bVar25;
  byte bVar26;
  v_array<float> preds;
  float local_98 [26];
  
  bVar26 = 0;
  pcVar9 = get_observed_cost(&(ec->l).cb);
  c->observation = pcVar9;
  if (pcVar9 != (cb_class *)0x0) {
    c->total = c->total + 1.0;
    pbVar2 = (ec->super_example_predict).indices._end;
    for (pbVar15 = (ec->super_example_predict).indices._begin; pbVar15 != pbVar2;
        pbVar15 = pbVar15 + 1) {
      if (c->namespaces[*pbVar15] == true) {
        GD::foreach_feature<MWT::mwt,_&MWT::value_policy,_vw_*>
                  (&c->all,(ec->super_example_predict).feature_space + *pbVar15,c,0,1.0);
      }
    }
    puVar3 = (c->policies)._end;
    for (puVar10 = (c->policies)._begin; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      uVar4 = *puVar10;
      ppVar17 = (c->evals)._begin;
      pcVar9 = c->observation;
      dVar8 = 0.0;
      if (pcVar9->action == ppVar17[uVar4].action) {
        dVar8 = (double)(pcVar9->cost / pcVar9->probability);
      }
      ppVar17 = ppVar17 + uVar4;
      ppVar17->cost = dVar8 + ppVar17->cost;
      (c->evals)._begin[uVar4].action = 0;
    }
  }
  v_array<unsigned_char>::clear(&c->indices);
  pvVar5 = c->all;
  bVar25 = (pvVar5->weights).sparse != false;
  puVar22 = &(pvVar5->weights).dense_weights._weight_mask;
  if (bVar25) {
    puVar22 = &(pvVar5->weights).sparse_weights._weight_mask;
  }
  uVar6 = *puVar22;
  pbVar15 = (ec->super_example_predict).indices._begin;
  puVar13 = &(pvVar5->weights).dense_weights._stride_shift;
  if (bVar25) {
    puVar13 = &(pvVar5->weights).sparse_weights._stride_shift;
  }
  pbVar2 = (ec->super_example_predict).indices._end;
  uVar1 = *puVar13;
  for (; pbVar15 != pbVar2; pbVar15 = pbVar15 + 1) {
    preds._begin = (float *)CONCAT71(preds._begin._1_7_,*pbVar15);
    if (c->namespaces[*pbVar15] == true) {
      v_array<unsigned_char>::push_back(&c->indices,(uchar *)&preds);
      features::clear(c->feature_space + ((ulong)preds._begin & 0xff));
      uVar14 = (ulong)preds._begin & 0xff;
      pfVar23 = (ec->super_example_predict).feature_space[uVar14].values._end;
      puVar16 = (ec->super_example_predict).feature_space[uVar14].indicies._begin;
      for (pfVar19 = (ec->super_example_predict).feature_space[uVar14].values._begin;
          pfVar19 != pfVar23; pfVar19 = pfVar19 + 1) {
        uVar14 = (ulong)*pfVar19;
        features::push_back(c->feature_space + ((ulong)preds._begin & 0xff),1.0,
                            ((long)(*pfVar19 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14) +
                            (ulong)c->num_classes * ((*puVar16 & uVar6) >> ((byte)uVar1 & 0x3f)) <<
                            ((byte)uVar1 & 0x3f));
        puVar16 = puVar16 + 1;
      }
      pfVar20 = (ec->super_example_predict).feature_space + ((ulong)preds._begin & 0xff);
      pfVar19 = local_98;
      pfVar18 = c->feature_space + ((ulong)preds._begin & 0xff);
      pfVar23 = pfVar19;
      for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(float **)pfVar23 = (pfVar18->values)._begin;
        pfVar18 = (features *)((long)pfVar18 + (ulong)bVar26 * -0x10 + 8);
        pfVar23 = pfVar23 + ((ulong)bVar26 * -2 + 1) * 2;
      }
      lVar11 = 100;
      pfVar18 = pfVar20;
      pfVar24 = c->feature_space + ((ulong)preds._begin & 0xff);
      for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined1 *)&(pfVar24->values)._begin = *(undefined1 *)&(pfVar18->values)._begin;
        pfVar18 = (features *)((long)pfVar18 + (ulong)bVar26 * -2 + 1);
        pfVar24 = (features *)((long)pfVar24 + (ulong)bVar26 * -2 + 1);
      }
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined1 *)&(pfVar20->values)._begin = *(undefined1 *)pfVar19;
        pfVar19 = (float *)((long)pfVar19 + (ulong)bVar26 * -2 + 1);
        pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -2 + 1);
      }
    }
  }
  preds._begin = (ec->pred).scalars._begin;
  preds._end = (ec->pred).scalars._end;
  preds.end_array = (ec->pred).scalars.end_array;
  preds.erase_count = (ec->pred).scalars.erase_count;
  LEARNER::learner<char,_example>::learn(base,ec,0);
  while (puVar7 = (c->indices)._end, puVar7 != (c->indices)._begin) {
    (c->indices)._end = puVar7 + -1;
    pfVar18 = c->feature_space + puVar7[-1];
    pfVar24 = (ec->super_example_predict).feature_space + puVar7[-1];
    pfVar20 = pfVar18;
    pfVar19 = local_98;
    for (lVar11 = 0xd; lVar12 = 100, pfVar21 = pfVar24, lVar11 != 0; lVar11 = lVar11 + -1) {
      *(float **)pfVar19 = (pfVar20->values)._begin;
      pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -0x10 + 8);
      pfVar19 = pfVar19 + ((ulong)bVar26 * -2 + 1) * 2;
    }
    for (; lVar11 = 100, pfVar19 = local_98, lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined1 *)&(pfVar18->values)._begin = *(undefined1 *)&(pfVar21->values)._begin;
      pfVar21 = (features *)((long)pfVar21 + (ulong)bVar26 * -2 + 1);
      pfVar18 = (features *)((long)pfVar18 + (ulong)bVar26 * -2 + 1);
    }
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined1 *)&(pfVar24->values)._begin = *(undefined1 *)pfVar19;
      pfVar19 = (float *)((long)pfVar19 + (ulong)bVar26 * -2 + 1);
      pfVar24 = (features *)((long)pfVar24 + (ulong)bVar26 * -2 + 1);
    }
  }
  v_array<float>::clear(&preds);
  local_98[0] = (float)(ec->pred).multiclass;
  v_array<float>::push_back(&preds,local_98);
  puVar3 = (c->policies)._end;
  for (puVar10 = (c->policies)._begin; puVar10 != puVar3; puVar10 = puVar10 + 1) {
    local_98[0] = (float)(c->evals)._begin[*puVar10].cost / (float)c->total;
    v_array<float>::push_back(&preds,local_98);
  }
  (ec->pred).scalars.end_array = preds.end_array;
  (ec->pred).scalars.erase_count = preds.erase_count;
  (ec->pred).scalars._begin = preds._begin;
  (ec->pred).scalars._end = preds._end;
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}